

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::ExpectationBase::DescribeLocationTo(ExpectationBase *this,ostream *os)

{
  ostream *poVar1;
  string local_30 [32];
  
  testing::internal::FormatFileLocation_abi_cxx11_((char *)local_30,(int)this->file_);
  poVar1 = std::operator<<(os,local_30);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void DescribeLocationTo(::std::ostream* os) const {
    *os << FormatFileLocation(file(), line()) << " ";
  }